

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O3

int64_t aom_highbd_get_y_sse(YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b)

{
  int64_t iVar1;
  
  iVar1 = highbd_get_sse((a->field_5).field_0.y_buffer,(a->field_4).field_0.y_stride,
                         (b->field_5).field_0.y_buffer,(b->field_4).field_0.y_stride,
                         (a->field_2).field_0.y_crop_width,(a->field_3).field_0.y_crop_height);
  return iVar1;
}

Assistant:

int64_t aom_highbd_get_y_sse(const YV12_BUFFER_CONFIG *a,
                             const YV12_BUFFER_CONFIG *b) {
  assert(a->y_crop_width == b->y_crop_width);
  assert(a->y_crop_height == b->y_crop_height);
  assert((a->flags & YV12_FLAG_HIGHBITDEPTH) != 0);
  assert((b->flags & YV12_FLAG_HIGHBITDEPTH) != 0);

  return highbd_get_sse(a->y_buffer, a->y_stride, b->y_buffer, b->y_stride,
                        a->y_crop_width, a->y_crop_height);
}